

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O3

int bssl::SSL_SESSION_parse_crypto_buffer
              (CBS *cbs,UniquePtr<CRYPTO_BUFFER> *out,CBS_ASN1_TAG tag,CRYPTO_BUFFER_POOL *pool)

{
  int iVar1;
  CRYPTO_BUFFER *__p;
  CBS child;
  CBS value;
  CBS local_40;
  CBS local_30;
  
  iVar1 = CBS_peek_asn1_tag(cbs,tag);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = CBS_get_asn1(cbs,&local_40,tag);
    if (((iVar1 != 0) && (iVar1 = CBS_get_asn1(&local_40,&local_30,4), iVar1 != 0)) &&
       (local_40.len == 0)) {
      __p = CRYPTO_BUFFER_new_from_CBS(&local_30,pool);
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)out,__p);
      return (uint)((out->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
                   (crypto_buffer_st *)0x0);
    }
    iVar1 = 0;
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x19b);
  }
  return iVar1;
}

Assistant:

static int SSL_SESSION_parse_crypto_buffer(CBS *cbs,
                                           UniquePtr<CRYPTO_BUFFER> *out,
                                           CBS_ASN1_TAG tag,
                                           CRYPTO_BUFFER_POOL *pool) {
  if (!CBS_peek_asn1_tag(cbs, tag)) {
    return 1;
  }

  CBS child, value;
  if (!CBS_get_asn1(cbs, &child, tag) ||
      !CBS_get_asn1(&child, &value, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return 0;
  }
  out->reset(CRYPTO_BUFFER_new_from_CBS(&value, pool));
  if (*out == nullptr) {
    return 0;
  }
  return 1;
}